

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O1

void test_construct(void)

{
  _Bool _Var1;
  int iVar2;
  bitset_t *bitset;
  size_t sVar3;
  int k;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar4 = 0;
  bitset = bitset_create();
  do {
    uVar5 = uVar4 >> 6;
    if (uVar5 < bitset->arraysize) {
LAB_0010284a:
      bitset->array[uVar5] = bitset->array[uVar5] | 1L << ((byte)uVar4 & 0x3f);
    }
    else {
      _Var1 = bitset_grow(bitset,uVar5 + 1);
      if (_Var1) goto LAB_0010284a;
    }
    uVar4 = uVar4 + 3;
    if (uVar4 == 3000) {
      iVar2 = compute_cardinality(bitset);
      _assert_true((ulong)(iVar2 == 1000),"compute_cardinality(b) == 1000",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                   ,0x52);
      sVar3 = bitset_count(bitset);
      _assert_true((ulong)(sVar3 == 1000),"bitset_count(b) == 1000",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                   ,0x53);
      uVar4 = 0;
      do {
        if (uVar4 >> 6 < bitset->arraysize) {
          bVar6 = (bitset->array[uVar4 >> 6] >> (uVar4 & 0x3f) & 1) != 0;
        }
        else {
          bVar6 = false;
        }
        _assert_true((ulong)(byte)((int)uVar4 != (int)((uVar4 & 0xffffffff) / 3) * 3 ^ bVar6),
                     "bitset_get(b, k) == (k / 3 * 3 == k)",
                     "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
                     ,0x55);
        uVar4 = uVar4 + 1;
      } while (uVar4 != 3000);
      bitset_free(bitset);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(test_construct) {
    bitset_t *b = bitset_create();
    for (int k = 0; k < 1000; ++k) bitset_set(b, 3 * k);
    assert_true(compute_cardinality(b) == 1000);
    assert_true(bitset_count(b) == 1000);
    for (int k = 0; k < 3 * 1000; ++k)
        assert_true(bitset_get(b, k) == (k / 3 * 3 == k));
    bitset_free(b);
}